

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  _Alloc_hider filename_00;
  bool bVar1;
  bool bVar2;
  string *in_base;
  cmMessenger *messenger;
  ListFileScope scope;
  string filenametoread;
  cmListFile listFile;
  ListFileScope LStack_78;
  string local_68;
  cmStateDirectory local_48;
  
  cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_48);
  cmsys::SystemTools::CollapseFullPath(&local_68,filename,in_base);
  ListFileScope::ListFileScope(&LStack_78,this,&local_68);
  filename_00._M_p = local_68._M_dataplus._M_p;
  local_48.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_48.DirectoryState.Position = 0;
  local_48.Snapshot_.State = (cmState *)0x0;
  messenger = cmake::GetMessenger(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmListFile::ParseFile((cmListFile *)&local_48,filename_00._M_p,messenger,&this->Backtrace)
  ;
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_48,&local_68);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar2 = cmSystemTools::GetInterruptFlag();
      if (!bVar2) goto LAB_002e9fc0;
    }
    LStack_78.ReportError = false;
  }
LAB_002e9fc0:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_48);
  ListFileScope::~ListFileScope(&LStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}